

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O0

string * prometheus::detail::base64_decode(string *__return_storage_ptr__,string *input)

{
  bool bVar1;
  ulong uVar2;
  runtime_error *prVar3;
  reference pcVar4;
  difference_type dVar5;
  char cVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  ulong local_50;
  size_t i;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  const_iterator it;
  uint32_t temp;
  size_t padding;
  string *input_local;
  string *decoded;
  
  uVar2 = std::__cxx11::string::length();
  if ((uVar2 & 3) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Invalid base64 length!");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::length();
    std::__cxx11::string::operator[]((ulong)input);
    std::__cxx11::string::length();
    std::__cxx11::string::operator[]((ulong)input);
  }
  it._M_current._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  it._M_current._0_4_ = 0;
  local_40._M_current = (char *)std::__cxx11::string::begin();
  do {
    i = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator<
                      (&local_40,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&i);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    for (local_50 = 0; cVar6 = (char)__return_storage_ptr__, local_50 < 4; local_50 = local_50 + 1)
    {
      it._M_current._0_4_ = (uint)it._M_current << 6;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_40);
      if ((*pcVar4 < 'A') ||
         (pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_40), 'Z' < *pcVar4)) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_40);
        if ((*pcVar4 < 'a') ||
           (pcVar4 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_40), 'z' < *pcVar4)) {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_40);
          if ((*pcVar4 < '0') ||
             (pcVar4 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_40), '9' < *pcVar4)) {
            pcVar4 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_40);
            if (*pcVar4 == '+') {
              it._M_current._0_4_ = (uint)it._M_current | 0x3e;
            }
            else {
              pcVar4 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_40);
              if (*pcVar4 != '/') {
                pcVar4 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_40);
                if (*pcVar4 != '=') {
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar3,"Invalid character in base64!");
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_58._M_current = (char *)std::__cxx11::string::end();
                dVar5 = __gnu_cxx::operator-(&local_58,&local_40);
                if (dVar5 != 1) {
                  if (dVar5 == 2) {
                    std::__cxx11::string::push_back(cVar6);
                    return __return_storage_ptr__;
                  }
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar3,"Invalid padding in base64!");
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                std::__cxx11::string::push_back(cVar6);
                std::__cxx11::string::push_back(cVar6);
                return __return_storage_ptr__;
              }
              it._M_current._0_4_ = (uint)it._M_current | 0x3f;
            }
          }
          else {
            pcVar4 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_40);
            it._M_current._0_4_ = (int)*pcVar4 + 4U | (uint)it._M_current;
          }
        }
        else {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_40);
          it._M_current._0_4_ = (int)*pcVar4 - 0x47U | (uint)it._M_current;
        }
      }
      else {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_40);
        it._M_current._0_4_ = (int)*pcVar4 - 0x41U | (uint)it._M_current;
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_40);
    }
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
  } while( true );
}

Assistant:

inline std::string base64_decode(const std::string& input) {
  if (input.length() % 4) {
    throw std::runtime_error("Invalid base64 length!");
  }

  std::size_t padding = 0;

  if (!input.empty()) {
    if (input[input.length() - 1] == kPadCharacter) padding++;
    if (input[input.length() - 2] == kPadCharacter) padding++;
  }

  std::string decoded;
  decoded.reserve(((input.length() / 4) * 3) - padding);

  std::uint32_t temp = 0;
  auto it = input.begin();

  while (it < input.end()) {
    for (std::size_t i = 0; i < 4; ++i) {
      temp <<= 6;
      if (*it >= 0x41 && *it <= 0x5A) {
        temp |= *it - 0x41;
      } else if (*it >= 0x61 && *it <= 0x7A) {
        temp |= *it - 0x47;
      } else if (*it >= 0x30 && *it <= 0x39) {
        temp |= *it + 0x04;
      } else if (*it == 0x2B) {
        temp |= 0x3E;
      } else if (*it == 0x2F) {
        temp |= 0x3F;
      } else if (*it == kPadCharacter) {
        switch (input.end() - it) {
          case 1:
            decoded.push_back((temp >> 16) & 0x000000FF);
            decoded.push_back((temp >> 8) & 0x000000FF);
            return decoded;
          case 2:
            decoded.push_back((temp >> 10) & 0x000000FF);
            return decoded;
          default:
            throw std::runtime_error("Invalid padding in base64!");
        }
      } else {
        throw std::runtime_error("Invalid character in base64!");
      }

      ++it;
    }

    decoded.push_back((temp >> 16) & 0x000000FF);
    decoded.push_back((temp >> 8) & 0x000000FF);
    decoded.push_back((temp) & 0x000000FF);
  }

  return decoded;
}